

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O1

void __thiscall CVmObjByteArray::notify_delete(CVmObjByteArray *this,int param_1)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint *puVar8;
  ulong uVar9;
  
  puVar8 = (uint *)(this->super_CVmObject).ext_;
  if (puVar8 == (uint *)0x0) {
    return;
  }
  uVar1 = *puVar8;
  uVar4 = (ulong)uVar1;
  if (uVar4 != 0) {
    puVar8 = puVar8 + 1;
    uVar5 = uVar4;
    uVar7 = 0;
    do {
      if (uVar5 != 0) {
        lVar2 = *(long *)puVar8;
        uVar6 = 0;
        uVar9 = uVar5;
        do {
          free(*(void **)(lVar2 + uVar6 * 8));
          uVar5 = 0;
          if (0x7fff < uVar9) {
            uVar5 = uVar9 - 0x8000;
          }
        } while ((uVar6 < 0x1fff) &&
                (uVar6 = uVar6 + 1, bVar3 = 0x8000 < uVar9, uVar9 = uVar5, bVar3));
      }
      free(*(void **)puVar8);
      if (uVar4 == 0) break;
      puVar8 = puVar8 + 2;
      bVar3 = uVar7 < uVar1 >> 0x1c;
      uVar7 = uVar7 + 1;
    } while (bVar3);
  }
  (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])(G_mem_X->varheap_,(this->super_CVmObject).ext_);
  return;
}

Assistant:

void CVmObjByteArray::notify_delete(VMG_ int /*in_root_set*/)
{
    size_t slot;
    unsigned char ***slotp;
    size_t slot_cnt;
    size_t bytes_rem;

    /* if we have no extension, there's nothing to do */
    if (ext_ == 0)
        return;

    /* calculate the number of second-level page table slots */
    slot_cnt = (size_t)(get_element_count() == 0
                        ? 0
                        : ((get_element_count() >> 28) + 1));

    /* we have all of the bytes in the array left do delete */
    bytes_rem = get_element_count();

    /* traverse the list of second-level page tables and delete each one */
    for (slot = 0, slotp = get_page_table_array() ; slot < slot_cnt ;
         ++slot, ++slotp)
    {
        size_t pg;
        unsigned char **pgp;
        
        /* traverse each page in this page table */
        for (pg = 0, pgp = *slotp ; pg < 8*1024 && bytes_rem != 0 ;
             ++pg, ++pgp)
        {
            /* delete this page */
            t3free(*pgp);

            /* 
             *   deduct this page's size from the remaining bytes to delete
             *   - the page size is up to 32k, but no more than the
             *   remaining size
             */
            if (bytes_rem > 32*1024)
                bytes_rem -= 32*1024;
            else
                bytes_rem = 0;
        }

        /* delete this page table */
        t3free(*slotp);
    }

    /* free our extension */
    G_mem->get_var_heap()->free_mem(ext_);
}